

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mullwo(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 t1;
  TCGv_i32 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx_00);
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  uVar1 = rA(ctx->opcode);
  tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,ret,cpu_gpr[uVar1]);
  uVar1 = rB(ctx->opcode);
  tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,ret_00,cpu_gpr[uVar1]);
  tcg_gen_muls2_i32_ppc64(tcg_ctx_00,ret,ret_00,ret,ret_00);
  uVar1 = rD(ctx->opcode);
  tcg_gen_concat_i32_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar1],ret,ret_00);
  tcg_gen_sari_i32_ppc64(tcg_ctx_00,ret,ret,0x1f);
  tcg_gen_setcond_i32_ppc64(tcg_ctx_00,TCG_COND_NE,ret,ret,ret_00);
  tcg_gen_extu_i32_i64_ppc64(tcg_ctx_00,cpu_ov,ret);
  if ((ctx->insns_flags2 & 0x80000) != 0) {
    tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_ov32,cpu_ov);
  }
  tcg_gen_or_i64_ppc64(tcg_ctx_00,cpu_so,cpu_so,cpu_ov);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    uVar1 = rD(ctx->opcode);
    gen_set_Rc0(ctx,cpu_gpr[uVar1]);
  }
  return;
}

Assistant:

static void gen_mullwo(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_trunc_tl_i32(tcg_ctx, t0, cpu_gpr[rA(ctx->opcode)]);
    tcg_gen_trunc_tl_i32(tcg_ctx, t1, cpu_gpr[rB(ctx->opcode)]);
    tcg_gen_muls2_i32(tcg_ctx, t0, t1, t0, t1);
#if defined(TARGET_PPC64)
    tcg_gen_concat_i32_i64(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t0, t1);
#else
    tcg_gen_mov_i32(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t0);
#endif

    tcg_gen_sari_i32(tcg_ctx, t0, t0, 31);
    tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, t0, t0, t1);
    tcg_gen_extu_i32_tl(tcg_ctx, cpu_ov, t0);
    if (is_isa300(ctx)) {
        tcg_gen_mov_tl(tcg_ctx, cpu_ov32, cpu_ov);
    }
    tcg_gen_or_tl(tcg_ctx, cpu_so, cpu_so, cpu_ov);

    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}